

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O1

void nonius::go<std::chrono::_V2::system_clock>
               (configuration *cfg,benchmark_registry *benchmarks,reporter_registry *reporters)

{
  iterator iVar1;
  undefined8 *puVar2;
  configuration cStack_168;
  
  iVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<nonius::reporter,_std::default_delete<nonius::reporter>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<nonius::reporter,_std::default_delete<nonius::reporter>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&reporters->_M_h,&cfg->reporter);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<nonius::reporter,_std::default_delete<nonius::reporter>_>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    validate_benchmarks<std::chrono::_V2::system_clock,__gnu_cxx::__normal_iterator<nonius::benchmark*,std::vector<nonius::benchmark,std::allocator<nonius::benchmark>>>>
              ((benchmarks->
               super__Vector_base<nonius::benchmark,_std::allocator<nonius::benchmark>_>)._M_impl.
               super__Vector_impl_data._M_start,
               (benchmarks->
               super__Vector_base<nonius::benchmark,_std::allocator<nonius::benchmark>_>)._M_impl.
               super__Vector_impl_data._M_finish);
    configuration::configuration(&cStack_168,cfg);
    go<std::chrono::_V2::system_clock,__gnu_cxx::__normal_iterator<nonius::benchmark*,std::vector<nonius::benchmark,std::allocator<nonius::benchmark>>>>
              (&cStack_168,
               (benchmarks->
               super__Vector_base<nonius::benchmark,_std::allocator<nonius::benchmark>_>)._M_impl.
               super__Vector_impl_data._M_start,
               (benchmarks->
               super__Vector_base<nonius::benchmark,_std::allocator<nonius::benchmark>_>)._M_impl.
               super__Vector_impl_data._M_finish,
               *(reporter **)
                ((long)iVar1.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<nonius::reporter,_std::default_delete<nonius::reporter>_>_>,_true>
                       ._M_cur + 0x28));
    optional<nonius::run_configuration>::destroy(&cStack_168.params.run);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&cStack_168.params);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cStack_168.filter_pattern._M_dataplus._M_p != &cStack_168.filter_pattern.field_2) {
      operator_delete(cStack_168.filter_pattern._M_dataplus._M_p,
                      cStack_168.filter_pattern.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cStack_168.reporter._M_dataplus._M_p != &cStack_168.reporter.field_2) {
      operator_delete(cStack_168.reporter._M_dataplus._M_p,
                      cStack_168.reporter.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cStack_168.output_file._M_dataplus._M_p != &cStack_168.output_file.field_2) {
      operator_delete(cStack_168.output_file._M_dataplus._M_p,
                      cStack_168.output_file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cStack_168.title._M_dataplus._M_p != &cStack_168.title.field_2) {
      operator_delete(cStack_168.title._M_dataplus._M_p,
                      cStack_168.title.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = &PTR__no_such_reporter_0020c138;
  __cxa_throw(puVar2,&no_such_reporter::typeinfo,no_such_reporter::~no_such_reporter);
}

Assistant:

void go(configuration cfg, benchmark_registry& benchmarks = global_benchmark_registry(), reporter_registry& reporters = global_reporter_registry()) {
        auto it = reporters.find(cfg.reporter);
        if(it == reporters.end()) throw no_such_reporter();
        validate_benchmarks<Clock>(benchmarks.begin(), benchmarks.end());
        go<Clock>(cfg, benchmarks.begin(), benchmarks.end(), *it->second);
    }